

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tommytree.c
# Opt level: O3

void * tommy_tree_remove(tommy_tree *tree,void *data)

{
  tommy_tree_node *ptVar1;
  void *pvVar2;
  long in_FS_OFFSET;
  tommy_tree_node *node;
  tommy_tree_node *local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20 = (tommy_tree_node *)0x0;
  ptVar1 = tommy_tree_remove_node(tree->cmp,tree->root,data,&local_20);
  tree->root = ptVar1;
  if (local_20 == (tommy_tree_node *)0x0) {
    pvVar2 = (void *)0x0;
  }
  else {
    tree->count = tree->count - 1;
    pvVar2 = local_20->data;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return pvVar2;
  }
  __stack_chk_fail();
}

Assistant:

void* tommy_tree_remove(tommy_tree* tree, void* data)
{
	tommy_tree_node* node = 0;

	tree->root = tommy_tree_remove_node(tree->cmp, tree->root, data, &node);

	if (!node)
		return 0;

	--tree->count;

	return node->data;
}